

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

word Abc_SuppFindOne(Vec_Wrd_t *p,int nBits)

{
  int iVar;
  int local_28;
  int Var;
  int This;
  int Prev;
  word uMask;
  Vec_Wrd_t *pVStack_10;
  int nBits_local;
  Vec_Wrd_t *p_local;
  
  _This = 0;
  Var = -1;
  uMask._4_4_ = nBits;
  pVStack_10 = p;
  while( true ) {
    iVar = Abc_SuppGenFindBest(pVStack_10,uMask._4_4_,&local_28);
    if (local_28 <= Var) break;
    Var = local_28;
    Abc_SuppGenSelectVar(pVStack_10,uMask._4_4_,iVar);
    _This = 1L << ((byte)iVar & 0x3f) | _This;
  }
  return _This;
}

Assistant:

word Abc_SuppFindOne( Vec_Wrd_t * p, int nBits )
{
    word uMask = 0;
    int Prev = -1, This, Var;
    while ( 1 )
    {
        Var = Abc_SuppGenFindBest( p, nBits, &This );
        if ( Prev >= This )
            break;
        Prev = This;
        Abc_SuppGenSelectVar( p, nBits, Var );
        uMask |= (((word)1) << Var);
    }
    return uMask;
}